

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix.h
# Opt level: O0

Suffix __thiscall
mp::BasicSuffixSet<std::allocator<char>_>::Find
          (BasicSuffixSet<std::allocator<char>_> *this,StringRef name)

{
  StringRef name_00;
  bool bVar1;
  char *pcVar2;
  const_iterator this_00;
  char *in_RDI;
  iterator i;
  set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
  *in_stack_ffffffffffffff28;
  reference impl;
  Impl *in_stack_ffffffffffffff30;
  _Self local_b0 [3];
  string local_98 [112];
  _Self local_28 [4];
  SuffixBase local_8;
  
  pcVar2 = in_RDI + 8;
  std::__cxx11::string::string(local_98);
  name_00.size_ = (size_t)pcVar2;
  name_00.data_ = in_RDI;
  internal::SuffixBase::Impl::Impl
            (in_stack_ffffffffffffff30,name_00,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (int)in_stack_ffffffffffffff28,(SuffixTable *)0x11f900);
  this_00 = std::
            set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
            ::find(in_stack_ffffffffffffff28,(key_type *)0x11f911);
  local_28[0]._M_node = this_00._M_node;
  internal::SuffixBase::Impl::~Impl((Impl *)0x11f92f);
  std::__cxx11::string::~string(local_98);
  local_b0[0]._M_node =
       (_Base_ptr)
       std::
       set<mp::internal::SuffixBase::Impl,_mp::BasicSuffixSet<std::allocator<char>_>::SuffixNameLess,_std::allocator<mp::internal::SuffixBase::Impl>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::operator!=(local_28,local_b0);
  if (bVar1) {
    impl = std::_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl>::operator*
                     ((_Rb_tree_const_iterator<mp::internal::SuffixBase::Impl> *)0x11f971);
  }
  else {
    impl = (Impl *)0x0;
  }
  Suffix::Suffix((Suffix *)this_00._M_node,impl);
  return (Suffix)(SuffixBase)local_8.impl_;
}

Assistant:

Suffix Find(fmt::StringRef name) const {
    typename Set::iterator i = set_.find(SuffixImpl(name));
    return Suffix(i != set_.end() ? &*i : 0);
  }